

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void ParseLabel(void)

{
  byte bVar1;
  undefined4 uVar2;
  pointer pTVar3;
  uint32_t uVar4;
  undefined1 uVar5;
  pointer pTVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  SLabelTableEntry *label;
  char *pcVar12;
  EStatus EVar13;
  TextFilePos *__args;
  byte *pbVar14;
  char *pcVar15;
  ulong uVar16;
  uint32_t uVar17;
  uint uVar18;
  uint nvalue;
  aint equPageNum;
  char *p;
  char temp [2048];
  aint local_848;
  aint local_844;
  char *local_840;
  byte local_838 [2056];
  
  bVar7 = White();
  if (bVar7) {
    return;
  }
  if ((Options::syx == '\x01') && (iVar9 = ParseDirective(true), iVar9 != 0)) {
    iVar9 = SkipBlanks();
    if (iVar9 != 0) {
      return;
    }
    Error("Unexpected",lp,PASS3);
    return;
  }
  local_848 = -1;
  if (*lp == '\0') {
    pbVar14 = local_838;
  }
  else {
    pbVar14 = local_838;
    do {
      bVar7 = White();
      if (bVar7) break;
      bVar1 = *lp;
      if (((ulong)bVar1 < 0x3e) && ((0x2400080000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
      *pbVar14 = bVar1;
      pbVar14 = pbVar14 + 1;
      pcVar15 = lp + 1;
      pcVar12 = lp + 1;
      lp = pcVar15;
    } while (*pcVar12 != '\0');
  }
  pcVar15 = lp;
  *pbVar14 = 0;
  cVar8 = *lp;
  uVar17 = 0;
  if (cVar8 == '+') {
    bVar1 = lp[1];
    uVar17 = 0;
    if ((bVar1 - 0x30 < 10) && (iVar9 = isalnum((uint)(byte)lp[2]), uVar17 = 0, iVar9 == 0)) {
      pcVar15 = pcVar15 + 2;
      uVar17 = (int)(char)bVar1 - 0x30;
      cVar8 = *pcVar15;
      lp = pcVar15;
      if (cVar8 != '+') goto LAB_00121523;
    }
    if ((pcVar15[1] == '*') &&
       (iVar9 = isalnum((uint)(byte)pcVar15[2]),
       pTVar3 = smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
                super__Vector_impl_data._M_finish,
       pTVar6 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl
                .super__Vector_impl_data._M_finish, iVar9 == 0)) {
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("!sourcePosStack.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                      ,0x283,"void ParseLabel()");
      }
      lp = pcVar15 + 2;
      if (pass == 1) {
        __args = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
        if (smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<TextFilePos,std::allocator<TextFilePos>>::
          _M_realloc_insert<TextFilePos_const&>
                    ((vector<TextFilePos,std::allocator<TextFilePos>> *)&smartSmcLines,
                     (iterator)
                     smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                     _M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          uVar2 = *(undefined4 *)
                   &sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].field_0x14;
          pTVar3->colEnd =
               sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].colEnd;
          *(undefined4 *)&pTVar3->field_0x14 = uVar2;
          uVar17 = pTVar6[-1].line;
          uVar4 = pTVar6[-1].colBegin;
          pTVar3->filename = __args->filename;
          pTVar3->line = uVar17;
          pTVar3->colBegin = uVar4;
          smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish =
               smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].colBegin = 0xffffffff;
LAB_0012150e:
        uVar17 = 1;
      }
      else {
        uVar16 = ((long)smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (((uVar16 < smartSmcIndex || uVar16 - smartSmcIndex == 0) ||
            (smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_start[smartSmcIndex].filename !=
             sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].filename)) ||
           (smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_start[smartSmcIndex].line !=
            sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].line)) {
          pcVar15 = "mismatch of smart-SMC positions between passes";
LAB_001214ed:
          Error(pcVar15,(char *)0x0,PASS3);
          goto LAB_0012150e;
        }
        uVar17 = smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl
                 .super__Vector_impl_data._M_start[smartSmcIndex].colBegin;
        if (uVar17 == 0xffffffff) {
          pcVar15 = "unresolved smart-SMC symbol (no significant target)";
          goto LAB_001214ed;
        }
        smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_start[smartSmcIndex].colBegin = 0xffffffff;
      }
      smartSmcIndex = smartSmcIndex + 1;
      cVar8 = *lp;
      goto LAB_00121523;
    }
  }
  else {
LAB_00121523:
    if (cVar8 == ':') {
      lp = lp + 1;
    }
  }
  SkipBlanks();
  IsLabelNotFound = false;
  if (9 < local_838[0] - 0x30) {
    bVar7 = isMacroNext();
    if (bVar7) {
      if (uVar17 == 0) {
        SetLastParsedLabel((char *)local_838);
        return;
      }
      pcVar15 = "Macro name can\'t use SMC-offset";
      goto LAB_00121576;
    }
    iVar9 = NeedDEFL();
    iVar10 = NeedEQU();
    uVar5 = synerr;
    if (iVar10 == 0 && iVar9 == 0) {
      local_840 = lp;
      SkipBlanks(&local_840);
      cVar8 = *local_840;
      if (cVar8 == '@') {
        local_840 = local_840 + 1;
      }
      pcVar15 = GetID(&local_840);
      if ((pcVar15 != (char *)0x0) &&
         (iVar11 = CStructureTable::Emit
                             (&StructureTable,pcVar15,(char *)local_838,&local_840,
                              (uint)(cVar8 == '@')), iVar11 != 0)) {
        if (uVar17 != 0) {
          Error("Structure instance can\'t use SMC-offset",(char *)0x0,PASS3);
        }
        lp = local_840;
        pcVar15 = ValidateLabel((char *)local_838,true,false);
        if (pcVar15 == (char *)0x0) {
          return;
        }
        goto LAB_00121a87;
      }
      local_844 = CurAddress;
    }
    else {
      Relocation::isResultAffected = 0;
      synerr = 1;
      iVar11 = ParseExpression(&lp,&local_844);
      synerr = uVar5;
      if (iVar11 == 0) {
        Error("Expression error",lp,PASS3);
        local_844 = 0;
      }
      if ((iVar9 != 0) && (IsLabelNotFound != false)) {
        Error("Forward reference",(char *)0x0,EARLY);
      }
      if ((iVar10 != 0) && (bVar7 = comma(&lp), uVar5 = synerr, synerr = uVar5, bVar7)) {
        synerr = 1;
        iVar11 = ParseExpression(&lp,&local_848);
        synerr = uVar5;
        if (iVar11 == 0) {
          Error("Expression error",lp,PASS3);
          local_848 = -1;
        }
      }
      iVar11 = SkipBlanks(&lp);
      if (iVar11 == 0) {
        Error("Unexpected",lp,PASS3);
        SkipToEol(&lp);
      }
    }
    nvalue = local_844 + uVar17;
    pcVar15 = ValidateLabel((char *)local_838,true,false);
    if (pcVar15 == (char *)0x0) {
      return;
    }
    uVar18 = 2;
    if (iVar9 == 0) {
      SetLastParsedLabel(pcVar15);
      uVar18 = 0;
    }
    uVar18 = (uint)(uVar17 != 0) * 0x80 + (uint)(iVar10 != 0) * 4 | uVar18;
    if (pass == 2) {
      iVar9 = CLabelTable::Insert(&LabelTable,pcVar15,nvalue,uVar18,(short)local_848);
      if (iVar9 == 0) {
        iVar9 = CLabelTable::Update(&LabelTable,pcVar15,nvalue);
        if (iVar9 == 0) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                        ,0x307,"void ParseLabel()");
        }
        goto LAB_00121a87;
      }
LAB_001218e9:
      if (pass != 1) goto LAB_00121a87;
      iVar9 = CLabelTable::Insert(&LabelTable,pcVar15,nvalue,uVar18,(short)local_848);
      if (iVar9 != 0) goto LAB_00121a87;
      pcVar12 = "Duplicate label";
      EVar13 = EARLY;
    }
    else {
      if (pass != 3) goto LAB_001218e9;
      label = CLabelTable::Find(&LabelTable,pcVar15,true);
      if (label == (SLabelTableEntry *)0x0 && iVar9 != 0) {
        iVar11 = CLabelTable::Insert(&LabelTable,pcVar15,nvalue,uVar18,-1);
        if (iVar11 != 0) {
          label = CLabelTable::Find(&LabelTable,pcVar15,true);
          goto LAB_0012188c;
        }
      }
      else {
LAB_0012188c:
        if (label != (SLabelTableEntry *)0x0) {
          if (iVar9 == 0) {
            bVar7 = IsSldExportActive();
            if (bVar7) {
              if (iVar10 == 0) {
                WriteToSldFile((int)label->page,nvalue,'F',pcVar15);
                iVar9 = (int)label->page;
              }
              else {
                iVar9 = -1;
                WriteToSldFile(-1,nvalue,'D',pcVar15);
              }
              pcVar12 = ExportLabelToSld((char *)local_838,label);
              WriteToSldFile(iVar9,nvalue,'L',pcVar12);
            }
          }
          else {
            CLabelTable::Insert(&LabelTable,pcVar15,nvalue,uVar18,-1);
          }
          uVar18 = label->value;
          if (nvalue == uVar18) {
            label->updatePass = pass;
          }
          else {
            pcVar12 = (char *)operator_new__(0x800);
            snprintf(pcVar12,0x800,"previous value %u not equal %u",(ulong)uVar18,(ulong)nvalue);
            Warning("Label has different value in pass 3",pcVar12,W_PASS3);
            CLabelTable::Update(&LabelTable,pcVar15,nvalue);
            operator_delete__(pcVar12);
          }
          goto LAB_00121a87;
        }
      }
      pcVar12 = "Label not found";
      EVar13 = PASS3;
    }
    Error(pcVar12,pcVar15,EVar13);
LAB_00121a87:
    operator_delete__(pcVar15);
    return;
  }
  if (uVar17 == 0) {
    pbVar14 = local_838;
    do {
      bVar1 = *pbVar14;
      pbVar14 = pbVar14 + 1;
    } while (bVar1 - 0x30 < 10);
    if (bVar1 == 0) {
      iVar9 = NeedEQU();
      if ((iVar9 != 0) || (iVar9 = NeedDEFL(), iVar9 != 0)) {
        pcVar15 = "Number labels are allowed as address labels only, not for DEFL/=/EQU";
        pbVar14 = local_838;
        EVar13 = SUPPRESS;
        goto LAB_0012157d;
      }
      iVar9 = atoi((char *)local_838);
      bVar7 = CTemporaryLabelTable::InsertRefresh(&TemporaryLabelTable,iVar9);
      if (bVar7) {
        return;
      }
      pcVar15 = 
      "Temporary labels flow differs in this pass (missing/new temporary label or final pass source difference)"
      ;
      goto LAB_00121576;
    }
    pcVar15 = "Invalid temporary label (not a number)";
    pbVar14 = local_838;
  }
  else {
    pcVar15 = "Temporary label can\'t use SMC-offset";
LAB_00121576:
    pbVar14 = (byte *)0x0;
  }
  EVar13 = PASS3;
LAB_0012157d:
  Error(pcVar15,(char *)pbVar14,EVar13);
  return;
}

Assistant:

void ParseLabel() {
	if (White()) return;
	if (Options::syx.IsPseudoOpBOF && ParseDirective(true)) {
		if (!SkipBlanks()) Error("Unexpected", lp);
		return;
	}
	char temp[LINEMAX], * tp = temp, * ttp;
	aint val, equPageNum = LABEL_PAGE_UNDEFINED, smcOffset = 0;
	// copy the label name into `temp` array
	while (*lp && !White() && *lp != ':' && *lp != '=' && *lp != '+') {
		*tp = *lp; ++tp; ++lp;
	}
	*tp = 0;
	// handle the special SMC_offset syntax "<label>+<single_digit>"
	if ('+' == lp[0] && isdigit(byte(lp[1])) && !isalnum(byte(lp[2]))) {
		smcOffset = lp[1] - '0';
		lp += 2;
	}
	// handle the special SMC_offset syntax "<label>+*" to target significant immediate of the instruction
	if ('+' == lp[0] && '*' == lp[1] && !isalnum(byte(lp[2]))) {
		assert(!sourcePosStack.empty());
		smcOffset = 1;					// heuristic value 1 for first pass or when something fails
		lp += 2;
		if (1 == pass) {
			// put the current source position into smart-smc (if first pass, or missing record)
			smartSmcLines.push_back(sourcePosStack.back());
			smartSmcLines.back().colBegin = ~0U;		// mark as unresolved
		} else {
			if ((smartSmcLines.size() <= smartSmcIndex)
				|| smartSmcLines.at(smartSmcIndex) != sourcePosStack.back()) {
				Error("mismatch of smart-SMC positions between passes");
			} else {
				auto & smartSmcLine = smartSmcLines.at(smartSmcIndex);
				if (~0U == smartSmcLine.colBegin) {
					Error("unresolved smart-SMC symbol (no significant target)");
				} else {
					smcOffset = smartSmcLine.colBegin;	// use the smart value from previous pass
					smartSmcLine.colBegin = ~0U;		// mark as unsolved again
				}
			}
		}
		++smartSmcIndex;
	}
	if (*lp == ':') ++lp;	// eat the optional colon after label
	tp = temp;
	SkipBlanks();
	IsLabelNotFound = false;
	if (isdigit((byte)*tp)) {
		if (smcOffset) {
			Error("Temporary label can't use SMC-offset");
			return;
		}
		ttp = tp;
		while (*ttp && isdigit((byte)*ttp)) ++ttp;
		if (*ttp) {
			Error("Invalid temporary label (not a number)", temp);
			return;
		}
		if (NeedEQU() || NeedDEFL()) {
			Error("Number labels are allowed as address labels only, not for DEFL/=/EQU", temp, SUPPRESS);
			return;
		}
		val = atoi(tp);
		if (!TemporaryLabelTable.InsertRefresh(val)) {
			Error("Temporary labels flow differs in this pass (missing/new temporary label or final pass source difference)");
		}
	} else {
		if (isMacroNext()) {
			if (smcOffset) Error("Macro name can't use SMC-offset");
			else SetLastParsedLabel(tp);	// store raw label into "last parsed" without adding module/etc
			return;					// and don't add it to labels table at all
		}
		bool IsDEFL = NeedDEFL(), IsEQU = NeedEQU();
		if (IsDEFL || IsEQU) {
			Relocation::isResultAffected = false;
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("Expression error", lp);
				val = 0;
			}
			if (IsLabelNotFound && IsDEFL) Error("Forward reference", NULL, EARLY);
			// check for explicit page defined by EQU
			if (IsEQU && comma(lp)) {
				if (!ParseExpressionNoSyntaxError(lp, equPageNum)) {
					Error("Expression error", lp);
					equPageNum = LABEL_PAGE_UNDEFINED;
				}
			}

			// after EQU/DEFL expressions there must be <EOL>, anything else is syntax error
			// this was added in v1.17.1 after realizing the line `label=$+1 and 7`
			// does evaluate whole "$+1 and 7" as expression, not as instruction `and`
			// (same problem exists with and/or/xor and if you have macro named after operator)
			if (!SkipBlanks(lp)) {
				Error("Unexpected", lp);
				SkipToEol(lp);
			}

		} else {
			int gl = 0;
			char* p = lp,* n;
			SkipBlanks(p);
			if (*p == '@') {
				++p; gl = 1;
			}
			if ((n = GetID(p)) && StructureTable.Emit(n, tp, p, gl)) {
				if (smcOffset) Error("Structure instance can't use SMC-offset");
				lp = p;
				// this was instancing STRUCT, make it also define "main" label for future "local" ones
				tp = ValidateLabel(tp, true);
				if (tp) delete[] tp;
				return;
			}
			val = CurAddress;
		}
		val += smcOffset;
		ttp = tp;
		if (!(tp = ValidateLabel(tp, true))) {
			return;
		}
		// Copy label name to last parsed label variable
		if (!IsDEFL) SetLastParsedLabel(tp);
		unsigned traits = (IsEQU ? LABEL_IS_EQU : 0) | (IsDEFL ? LABEL_IS_DEFL : 0) | (smcOffset ? LABEL_IS_SMC : 0);
		if (pass == LASTPASS) {
			SLabelTableEntry* label = LabelTable.Find(tp, true);
			if (nullptr == label && IsDEFL) {	// DEFL labels can be defined as late as needed (including pass3)
				if (LabelTable.Insert(tp, val, traits)) label = LabelTable.Find(tp, true);
			}
			if (nullptr == label) {		// should have been already defined before last pass
				Error("Label not found", tp);
				delete[] tp;
				return;
			}
			if (IsDEFL) {		//re-set DEFL value
				LabelTable.Insert(tp, val, traits);
			} else if (IsSldExportActive()) {
				// SLD (Source Level Debugging) tracing-data logging
				WriteToSldFile(IsEQU ? -1 : label->page, val, IsEQU ? 'D' : 'F', tp);	//version 0
				WriteToSldFile(IsEQU ? -1 : label->page, val, 'L', ExportLabelToSld(ttp, label));	//version 1
			}

			if (val != label->value) {
				char* buf = new char[LINEMAX];

				SPRINTF2(buf, LINEMAX, "previous value %u not equal %u", label->value, val);
				Warning("Label has different value in pass 3", buf);
				LabelTable.Update(tp, val);

				delete[] buf;
			} else {
				label->updatePass = pass;	// just "touch" it here in third pass
			}
		} else if (pass == 2 && !LabelTable.Insert(tp, val, traits, equPageNum)) {
			if (!LabelTable.Update(tp, val)) assert(false); // unreachable, update will always work after insert failed
		} else if (pass == 1 && !LabelTable.Insert(tp, val, traits, equPageNum)) {
			Error("Duplicate label", tp, EARLY);
		}

// TODO v2.x: this is too complicated in current version: Unreal/Cspect already expect
// EQU/DEFL to be current page or "ROM" = not a big deal as they did change in v1.x course already.
// But also struct labels are set as EQU ones, so this has to split, and many other details.
// (will also need more than LABEL_PAGE_UNDEFINED value to deal with more states)
// 		if (IsEQU && comma(lp)) {	// Device extension: "<label> EQU <address>,<page number>"
// 			if (!DeviceID) {
// 				Error("EQU can set page to label only in device mode", line);
// 				SkipToEol(lp);
// 			} else if (!ParseExpression(lp, oval)) {	// try to read page number into "oval"
// 				Error("Expression error", lp);
// 				oval = -1;
// 			} else if (oval < 0 || Device->PagesCount <= oval) {
// 				ErrorInt("Invalid page number", oval);
// 				oval = -1;
// 			} else {
// 				if (val < 0 || 0xFFFF < val) Warning("The EQU address is outside of 16bit range", line);
// 				CLabelTableEntry* equLabel = LabelTable.Find(tp, true);	// must be already defined + found
// 				equLabel->page = oval;			// set it's page number
// 			}
// 		}

		delete[] tp;
	}
}